

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgc_stop(djg_clock *clock)

{
  GLint64 local_18;
  GLint64 now;
  djg_clock *clock_local;
  
  now = (GLint64)clock;
  if (clock != (djg_clock *)0x0) {
    if (clock->is_cpu_ticking != 0) {
      local_18 = 0;
      (*glad_glGetInteger64v)(0x8e28,&local_18);
      *(double *)now = (double)(local_18 - *(long *)(now + 0x10)) / 1000000000.0;
      *(undefined4 *)(now + 0x24) = 0;
    }
    if ((*(int *)(now + 0x20) != 0) && (*(int *)(now + 0x28) != 0)) {
      (*glad_glQueryCounter)(*(GLuint *)(now + 0x1c),0x8e28);
      *(undefined4 *)(now + 0x20) = 0;
    }
    return;
  }
  __assert_fail("clock",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                ,0x124,"void djgc_stop(djg_clock *)");
}

Assistant:

DJGDEF void djgc_stop(djg_clock *clock)
{
    DJG_ASSERT(clock);
    if (clock->is_cpu_ticking) {
        GLint64 now = 0;

        glGetInteger64v(GL_TIMESTAMP, &now);
        clock->cpu_ticks = (now - clock->cpu_start_ticks) / 1e9;
        clock->is_cpu_ticking = GL_FALSE;
    }
    if (clock->is_gpu_ticking && clock->is_gpu_ready) {
        glQueryCounter(clock->queries[DJGC__QUERY_STOP], GL_TIMESTAMP);
        clock->is_gpu_ticking = GL_FALSE;
    }
}